

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3648a::type_schema::validate
          (type_schema *this,json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  shared_ptr<(anonymous_namespace)::schema> *psVar1;
  json_pointer *pjVar2;
  type_schema *ptVar3;
  bool bVar4;
  reference rhs;
  shared_ptr<(anonymous_namespace)::schema> *psVar5;
  element_type *peVar6;
  const_iterator __begin3;
  const_iterator __end3;
  value_type type;
  allocator<char> local_e1;
  json_pointer *local_e0;
  error_handler *local_d8;
  undefined1 local_d0 [88];
  type_schema *local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  const_iterator local_60;
  shared_ptr<(anonymous_namespace)::schema> local_40;
  
  std::shared_ptr<(anonymous_namespace)::schema>::shared_ptr
            (&local_40,
             (this->type_).
             super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
             ._M_impl.super__Vector_impl_data._M_start + instance->m_type);
  local_e0 = ptr;
  local_d8 = e;
  if (local_40.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,"unexpected instance type",(allocator<char> *)&local_60);
    e = local_d8;
    (*local_d8->_vptr_error_handler[2])(local_d8,local_e0,instance,local_d0);
    std::__cxx11::string::~string((string *)local_d0);
  }
  else {
    (*(local_40.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      )->_vptr_schema[3])
              (local_40.
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               ptr,instance,patch,e);
  }
  if ((this->enum_).first == true) {
    this_00 = &(this->enum_).second;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin((const_iterator *)local_d0,this_00);
    e = local_d8;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend(&local_60,this_00);
    while( true ) {
      bVar4 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        ((const_iterator *)local_d0,&local_60);
      if (!bVar4) break;
      rhs = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator*((const_iterator *)local_d0);
      bVar4 = nlohmann::json_abi_v3_11_2::operator==(instance,rhs);
      if (bVar4) goto LAB_00118fff;
      nlohmann::json_abi_v3_11_2::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((const_iterator *)local_d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,"instance not found in required enum",(allocator<char> *)&local_60
              );
    (*e->_vptr_error_handler[2])(e,local_e0,instance,local_d0);
    std::__cxx11::string::~string((string *)local_d0);
  }
LAB_00118fff:
  if ((this->const_).first == true) {
    bVar4 = nlohmann::json_abi_v3_11_2::operator!=(&(this->const_).second,instance);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d0,"instance not const",(allocator<char> *)&local_60);
      (*e->_vptr_error_handler[2])(e,local_e0,instance,local_d0);
      std::__cxx11::string::~string((string *)local_d0);
    }
  }
  psVar1 = (this->logic_).
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  for (psVar5 = (this->logic_).
                super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar3 = local_78, psVar5 != psVar1;
      psVar5 = psVar5 + 1) {
    std::shared_ptr<(anonymous_namespace)::schema>::shared_ptr
              ((shared_ptr<(anonymous_namespace)::schema> *)local_d0,psVar5);
    (**(code **)(*(_func_int **)local_d0._0_8_ + 0x18))
              (local_d0._0_8_,local_e0,instance,patch,local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
  }
  if ((local_78->if_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    first_error_handler::first_error_handler((first_error_handler *)local_d0);
    pjVar2 = local_e0;
    peVar6 = (ptVar3->if_).
             super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar6->_vptr_schema[3])(peVar6,local_e0,instance,patch,local_d0);
    if (local_d0[8] == false) {
      peVar6 = (ptVar3->then_).
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      peVar6 = (ptVar3->else_).
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (peVar6 != (element_type *)0x0) {
      (*peVar6->_vptr_schema[3])(peVar6,pjVar2,instance,patch,local_d8);
    }
    first_error_handler::~first_error_handler((first_error_handler *)local_d0);
  }
  if (instance->m_type == null) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,"",&local_e1);
    nlohmann::json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60,(string_t *)local_d0);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&local_70,&(ptVar3->super_schema).default_value_);
    nlohmann::json_patch::add(patch,(json_pointer *)&local_60,&local_70);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_60);
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const override final
	{
		// depending on the type of instance run the type specific validator - if present
		auto type = type_[static_cast<uint8_t>(instance.type())];

		if (type)
			type->validate(ptr, instance, patch, e);
		else
			e.error(ptr, instance, "unexpected instance type");

		if (enum_.first) {
			bool seen_in_enum = false;
			for (auto &v : enum_.second)
				if (instance == v) {
					seen_in_enum = true;
					break;
				}

			if (!seen_in_enum)
				e.error(ptr, instance, "instance not found in required enum");
		}

		if (const_.first &&
		    const_.second != instance)
			e.error(ptr, instance, "instance not const");

		for (auto l : logic_)
			l->validate(ptr, instance, patch, e);

		if (if_) {
			first_error_handler err;

			if_->validate(ptr, instance, patch, err);
			if (!err) {
				if (then_)
					then_->validate(ptr, instance, patch, e);
			} else {
				if (else_)
					else_->validate(ptr, instance, patch, e);
			}
		}
		if (instance.is_null()) {
			patch.add(nlohmann::json::json_pointer{}, default_value_);
		}
	}